

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_scalars_test_json_parser.h
# Opt level: O0

char * optional_scalars_test_global_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *buf_00;
  char *pcVar2;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_type_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  ctx_local = (flatcc_json_parser_t *)buf;
  if (((uVar1 == 0x6f7074696f6e616c) &&
      (uVar1 = flatcc_json_parser_symbol_part(buf + 8,end), uVar1 == 0x5f7363616c617273)) &&
     (uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end), uVar1 == 0x2e4f7074696f6e61)) {
    buf_00 = buf + 0x18;
    uVar1 = flatcc_json_parser_symbol_part(buf_00,end);
    if ((uVar1 & 0xffffffffffffff00) == 0x6c466163746f7200) {
      pcVar2 = flatcc_json_parser_match_scope(ctx,buf_00,end,7);
      if (pcVar2 == buf_00) {
        return buf;
      }
      end_local = optional_scalars_OptionalFactor_parse_json_enum
                            (ctx,pcVar2,end,value_type,value,aggregate);
    }
    else {
      if ((uVar1 & 0xffffffffff000000) != 0x6c42797465000000) {
        return buf;
      }
      pcVar2 = flatcc_json_parser_match_scope(ctx,buf_00,end,5);
      if (pcVar2 == buf_00) {
        return buf;
      }
      end_local = optional_scalars_OptionalByte_parse_json_enum
                            (ctx,pcVar2,end,value_type,value,aggregate);
    }
    ctx_local = (flatcc_json_parser_t *)end_local;
  }
  return (char *)ctx_local;
}

Assistant:

static const char *optional_scalars_test_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w == 0x6f7074696f6e616c) { /* descend "optional" */
        buf += 8;
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x5f7363616c617273) { /* descend "_scalars" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w == 0x2e4f7074696f6e61) { /* descend ".Optiona" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x6c466163746f7200) { /* "lFactor" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                    if (buf != mark) {
                        buf = optional_scalars_OptionalFactor_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "lFactor" */
                    if ((w & 0xffffffffff000000) == 0x6c42797465000000) { /* "lByte" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                        if (buf != mark) {
                            buf = optional_scalars_OptionalByte_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "lByte" */
                        return unmatched;
                    } /* "lByte" */
                } /* "lFactor" */
            } else { /* descend ".Optiona" */
                return unmatched;
            } /* descend ".Optiona" */
        } else { /* descend "_scalars" */
            return unmatched;
        } /* descend "_scalars" */
    } else { /* descend "optional" */
        return unmatched;
    } /* descend "optional" */
    return buf;
}